

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPTCPTransmitter::ClearDestSockets(RTPTCPTransmitter *this)

{
  _Base_ptr this_00;
  RTPMemoryManager *in_RDX;
  _Base_ptr p_Var1;
  undefined1 auVar2 [16];
  
  p_Var1 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var1 != &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = p_Var1[1]._M_right;
    p_Var1[1]._M_right = (_Base_ptr)0x0;
    if (this_00 != (_Base_ptr)0x0) {
      RTPDeleteByteArray((jrtplib *)this_00,
                         (uint8_t *)(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,in_RDX);
    }
    auVar2 = std::_Rb_tree_increment(p_Var1);
    in_RDX = auVar2._8_8_;
    p_Var1 = auVar2._0_8_;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::clear(&(this->m_destSockets)._M_t);
  return;
}

Assistant:

void RTPTCPTransmitter::ClearDestSockets()
{
	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();

	while (it != end)
	{
		uint8_t *pBuf = it->second.ExtractDataBuffer();
		if (pBuf)
			RTPDeleteByteArray(pBuf, GetMemoryManager());

		++it;
	}
	m_destSockets.clear();
}